

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easm_print.c
# Opt level: O3

void easm_print_operand(FILE *out,envy_colors *cols,easm_operand *operand)

{
  long lVar1;
  
  easm_print_mods(out,cols,operand->mods,0);
  if (0 < operand->exprsnum) {
    lVar1 = 0;
    do {
      if (lVar1 != 0) {
        fprintf((FILE *)out," %s|%s",cols->sym,cols->reset);
      }
      fputc(0x20,(FILE *)out);
      easm_print_sexpr(out,cols,operand->exprs[lVar1],-1);
      lVar1 = lVar1 + 1;
    } while (lVar1 < operand->exprsnum);
  }
  return;
}

Assistant:

void easm_print_operand(FILE *out, const struct envy_colors *cols, struct easm_operand *operand) {
	int i;
	easm_print_mods(out, cols, operand->mods, 0);
	for (i = 0; i < operand->exprsnum; i++) {
		if (i)
			fprintf(out, " %s|%s", cols->sym, cols->reset);
		fprintf(out, " ");
		easm_print_sexpr(out, cols, operand->exprs[i], -1);
	}
}